

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

int elf_zstd_make_offset_baseline_fse
              (elf_zstd_fse_entry *fse_table,int table_bits,
              elf_zstd_fse_baseline_entry *baseline_table)

{
  byte bVar1;
  uchar uVar2;
  uint16_t uVar3;
  uint16_t *puVar4;
  elf_zstd_fse_entry *peVar5;
  ulong uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  
  uVar6 = (ulong)(uint)(1 << ((byte)table_bits & 0x1f));
  peVar5 = fse_table + uVar6;
  puVar4 = &baseline_table[uVar6 - 1].base;
  do {
    bVar1 = peVar5[-1].symbol;
    if (0x1f < bVar1) {
      return 0;
    }
    uVar3 = peVar5[-1].base;
    uVar2 = peVar5[-1].bits;
    uVar7 = 1 << (bVar1 & 0x1f);
    uVar8 = uVar7 - 3;
    if (bVar1 < 2) {
      uVar8 = uVar7;
    }
    peVar5 = peVar5 + -1;
    ((elf_zstd_fse_baseline_entry *)(puVar4 + -3))->baseline = uVar8;
    *(byte *)(puVar4 + -1) = bVar1;
    *(uchar *)((long)puVar4 + -1) = uVar2;
    *puVar4 = uVar3;
    puVar4 = puVar4 + -4;
  } while (fse_table < peVar5);
  return 1;
}

Assistant:

static int
elf_zstd_make_offset_baseline_fse (
    const struct elf_zstd_fse_entry *fse_table,
    int table_bits,
    struct elf_zstd_fse_baseline_entry *baseline_table)
{
  size_t count;
  const struct elf_zstd_fse_entry *pfse;
  struct elf_zstd_fse_baseline_entry *pbaseline;

  /* Convert backward to avoid overlap.  */

  count = 1U << table_bits;
  pfse = fse_table + count;
  pbaseline = baseline_table + count;
  while (pfse > fse_table)
    {
      unsigned char symbol;
      unsigned char bits;
      uint16_t base;

      --pfse;
      --pbaseline;
      symbol = pfse->symbol;
      bits = pfse->bits;
      base = pfse->base;
      if (unlikely (symbol > 31))
	{
	  elf_uncompress_failed ();
	  return 0;
	}

      /* The simple way to write this is

	   pbaseline->baseline = (uint32_t)1 << symbol;
	   pbaseline->basebits = symbol;

	 That will give us an offset value that corresponds to the one
	 described in the RFC.  However, for offset values > 3, we have to
	 subtract 3.  And for offset values 1, 2, 3 we use a repeated offset.
	 The baseline is always a power of 2, and is never 0, so for these low
	 values we will see one entry that is baseline 1, basebits 0, and one
	 entry that is baseline 2, basebits 1.  All other entries will have
	 baseline >= 4 and basebits >= 2.

	 So we can check for RFC offset <= 3 by checking for basebits <= 1.
	 And that means that we can subtract 3 here and not worry about doing
	 it in the hot loop.  */

      pbaseline->baseline = (uint32_t)1 << symbol;
      if (symbol >= 2)
	pbaseline->baseline -= 3;
      pbaseline->basebits = symbol;
      pbaseline->bits = bits;
      pbaseline->base = base;
    }

  return 1;
}